

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetDimTextLocation
          (ON_Annotation *this,ON_DimStyle *parent_style,TextLocation text_location)

{
  TextLocation TVar1;
  ON_DimStyle *pOVar2;
  ON_DimStyle *override_style;
  bool bCreate;
  TextLocation text_location_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  TVar1 = ON_DimStyle::DimTextLocation(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,text_location != TVar1);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetDimTextLocation(pOVar2,text_location);
    ON_DimStyle::SetFieldOverride(pOVar2,DimTextLocation,text_location != TVar1);
  }
  return;
}

Assistant:

void ON_Annotation::SetDimTextLocation(const ON_DimStyle* parent_style, ON_DimStyle::TextLocation text_location)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (text_location != parent_style->DimTextLocation());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetDimTextLocation(text_location);
    override_style->SetFieldOverride(ON_DimStyle::field::DimTextLocation, bCreate);
  }
}